

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewLine(void)

{
  ImGuiContext *pIVar1;
  ImVec2 local_2c;
  ImVec2 local_24;
  undefined4 local_1c;
  ImGuiContext *pIStack_18;
  ImGuiLayoutType backup_layout_type;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  g = (ImGuiContext *)GetCurrentWindow();
  pIVar1 = GImGui;
  if ((*(byte *)((long)(g->IO).KeyMap + 0x43) & 1) == 0) {
    pIStack_18 = GImGui;
    local_1c = *(undefined4 *)((g->IO).KeysDown + 0x43);
    (g->IO).KeysDown[0x43] = false;
    (g->IO).KeysDown[0x44] = false;
    (g->IO).KeysDown[0x45] = false;
    (g->IO).KeysDown[0x46] = false;
    if (*(float *)&(g->IO).ClipboardUserData <= 0.0) {
      ImVec2::ImVec2(&local_2c,0.0,pIVar1->FontSize);
      ItemSize(&local_2c,0.0);
    }
    else {
      ImVec2::ImVec2(&local_24,0.0,0.0);
      ItemSize(&local_24,0.0);
    }
    *(undefined4 *)((g->IO).KeysDown + 0x43) = local_1c;
  }
  return;
}

Assistant:

void ImGui::NewLine()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiLayoutType backup_layout_type = window->DC.LayoutType;
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    if (window->DC.CurrentLineHeight > 0.0f)     // In the event that we are on a line with items that is smaller that FontSize high, we will preserve its height.
        ItemSize(ImVec2(0,0));
    else
        ItemSize(ImVec2(0.0f, g.FontSize));
    window->DC.LayoutType = backup_layout_type;
}